

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int Cudd_BddToCubeArray(DdManager *dd,DdNode *cube,int *array)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int *piVar6;
  DdNode **ppDVar7;
  ulong uVar8;
  int index;
  DdNode *pDVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  DdNode *e;
  DdNode *t;
  DdNode *local_40;
  DdNode *local_38;
  
  uVar5 = Cudd_ReadSize(dd);
  auVar4 = _DAT_0093e4e0;
  auVar3 = _DAT_0093d220;
  auVar2 = _DAT_0093d210;
  pDVar9 = dd->one;
  if (0 < (int)uVar5) {
    lVar1 = (ulong)uVar5 - 1;
    auVar10._8_4_ = (int)lVar1;
    auVar10._0_8_ = lVar1;
    auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
    piVar6 = array + ((ulong)uVar5 - 1);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_0093d220;
    do {
      auVar12._8_4_ = (int)uVar8;
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = (int)(uVar8 >> 0x20);
      auVar13 = (auVar12 | auVar2) ^ auVar3;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        *piVar6 = 2;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar6[-1] = 2;
      }
      auVar12 = (auVar12 | auVar4) ^ auVar3;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
        piVar6[-2] = 2;
        piVar6[-3] = 2;
      }
      uVar8 = uVar8 + 4;
      piVar6 = piVar6 + -4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar8);
  }
  pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
  iVar11 = *(int *)((ulong)cube & 0xfffffffffffffffe);
  if (iVar11 != 0x7fffffff) {
    do {
      cuddGetBranches(cube,&local_38,&local_40);
      if (local_38 == pDVar9) {
        iVar14 = 0;
        ppDVar7 = &local_40;
      }
      else {
        iVar14 = 1;
        ppDVar7 = &local_38;
        if (local_40 != pDVar9) {
          return 0;
        }
      }
      array[iVar11] = iVar14;
      cube = *ppDVar7;
      iVar11 = *(int *)((ulong)cube & 0xfffffffffffffffe);
    } while (iVar11 != 0x7fffffff);
  }
  return (uint)(cube != pDVar9);
}

Assistant:

int
Cudd_BddToCubeArray(
  DdManager *dd,
  DdNode *cube,
  int *array)
{
    DdNode *scan, *t, *e;
    int i;
    int size = Cudd_ReadSize(dd);
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    for (i = size-1; i >= 0; i--) {
        array[i] = 2;
    }
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        int index = Cudd_Regular(scan)->index;
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            array[index] = 0;
            scan = e;
        } else if (e == zero) {
            array[index] = 1;
            scan = t;
        } else {
            return(0);  /* cube is not a cube */
        }
    }
    if (scan == zero) {
        return(0);
    } else {
        return(1);
    }

}